

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

bool __thiscall CLI::Option::check_name(Option *this,string *name)

{
  bool bVar1;
  __type _Var2;
  size_type sVar3;
  const_reference pvVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  long in_RDI;
  string local_name;
  string local_pname;
  size_type in_stack_fffffffffffffe18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe20;
  size_type in_stack_fffffffffffffe28;
  undefined7 in_stack_fffffffffffffe30;
  undefined1 in_stack_fffffffffffffe37;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe38;
  undefined7 in_stack_fffffffffffffe40;
  undefined1 in_stack_fffffffffffffe47;
  string *in_stack_fffffffffffffe58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe70;
  string *in_stack_fffffffffffffe78;
  Option *in_stack_fffffffffffffe80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8 [3];
  undefined1 local_68 [48];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  byte local_1;
  
  local_18 = in_RSI;
  sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::length
                    (in_RSI);
  if (((sVar3 < 3) ||
      (pvVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                operator[](in_stack_fffffffffffffe20,in_stack_fffffffffffffe18), *pvVar4 != '-')) ||
     (pvVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               operator[](in_stack_fffffffffffffe20,in_stack_fffffffffffffe18), *pvVar4 != '-')) {
    sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::length
                      (local_18);
    if ((sVar3 < 2) ||
       (pvVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 front(in_stack_fffffffffffffe20), *pvVar4 != '-')) {
      bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0x1c3e07);
      if (!bVar1) {
        ::std::__cxx11::string::string(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
        ::std::__cxx11::string::string(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
        if ((*(byte *)(in_RDI + 0x22) & 1) != 0) {
          ::std::__cxx11::string::string(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
          CLI::detail::remove_underscore(in_stack_fffffffffffffe68);
          in_stack_fffffffffffffe20 = local_c8;
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
          ::std::__cxx11::string::~string(in_stack_fffffffffffffe20);
          ::std::__cxx11::string::~string(in_stack_fffffffffffffe20);
          ::std::__cxx11::string::string(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
          CLI::detail::remove_underscore(in_stack_fffffffffffffe68);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
          ::std::__cxx11::string::~string(in_stack_fffffffffffffe20);
          ::std::__cxx11::string::~string(in_stack_fffffffffffffe20);
        }
        if ((*(byte *)(in_RDI + 0x21) & 1) != 0) {
          ::std::__cxx11::string::string(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
          CLI::detail::to_lower(in_stack_fffffffffffffe58);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
          ::std::__cxx11::string::~string(in_stack_fffffffffffffe20);
          ::std::__cxx11::string::~string(in_stack_fffffffffffffe20);
          ::std::__cxx11::string::string(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
          CLI::detail::to_lower(in_stack_fffffffffffffe58);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
          ::std::__cxx11::string::~string(in_stack_fffffffffffffe20);
          ::std::__cxx11::string::~string(in_stack_fffffffffffffe20);
        }
        _Var2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40),
                                  in_stack_fffffffffffffe38);
        if (_Var2) {
          local_1 = 1;
        }
        ::std::__cxx11::string::~string(in_stack_fffffffffffffe20);
        ::std::__cxx11::string::~string(in_stack_fffffffffffffe20);
        if (_Var2) goto LAB_001c4140;
      }
      bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0x1c4110);
      if (bVar1) {
        local_1 = 0;
      }
      else {
        local_1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40)
                                    ,in_stack_fffffffffffffe38);
      }
    }
    else {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (in_stack_fffffffffffffe38,
                 CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30),(size_type)local_68);
      local_1 = check_sname(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
      ::std::__cxx11::string::~string(in_stack_fffffffffffffe20);
    }
  }
  else {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_38,CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30),
               in_stack_fffffffffffffe28);
    local_1 = check_lname(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
    ::std::__cxx11::string::~string(in_stack_fffffffffffffe20);
  }
LAB_001c4140:
  return (bool)(local_1 & 1);
}

Assistant:

CLI11_NODISCARD CLI11_INLINE bool Option::check_name(const std::string &name) const {

    if(name.length() > 2 && name[0] == '-' && name[1] == '-')
        return check_lname(name.substr(2));
    if(name.length() > 1 && name.front() == '-')
        return check_sname(name.substr(1));
    if(!pname_.empty()) {
        std::string local_pname = pname_;
        std::string local_name = name;
        if(ignore_underscore_) {
            local_pname = detail::remove_underscore(local_pname);
            local_name = detail::remove_underscore(local_name);
        }
        if(ignore_case_) {
            local_pname = detail::to_lower(local_pname);
            local_name = detail::to_lower(local_name);
        }
        if(local_name == local_pname) {
            return true;
        }
    }

    if(!envname_.empty()) {
        // this needs to be the original since envname_ shouldn't match on case insensitivity
        return (name == envname_);
    }
    return false;
}